

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.h
# Opt level: O1

string * __thiscall Token::toString_abi_cxx11_(string *__return_storage_ptr__,Token *this)

{
  TokenType type;
  pointer pcVar1;
  
  type = this->type;
  if (((ulong)type < 0x29) && ((0x100041c0000U >> ((ulong)type & 0x3f) & 1) != 0)) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (this->literal)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + (this->literal)._M_string_length);
  }
  else {
    tokTypeToString_abi_cxx11_(__return_storage_ptr__,type);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string toString() {
        if (type == TokenType::String ||
            type == TokenType::Integer ||
            type == TokenType::Float ||
            type == TokenType::Identifier ||
            type == TokenType::Error) {
            return literal;
        } else return tokTypeToString(type);
    }